

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessenger.cxx
# Opt level: O0

void __thiscall
cmMessenger::PrintBacktraceTitle(cmMessenger *this,ostream *out,cmListFileBacktrace *bt)

{
  bool bVar1;
  cmListFileContext *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *top;
  ostream *os;
  char *local_d8;
  string local_b0;
  undefined1 local_90 [8];
  cmListFileContext lfc;
  cmListFileBacktrace *bt_local;
  ostream *out_local;
  cmMessenger *this_local;
  
  lfc.DeferId.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._32_8_ = bt;
  bVar1 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Empty
                    (&bt->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>);
  if (!bVar1) {
    pcVar2 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                       ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)
                        lfc.DeferId.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._32_8_);
    cmListFileContext::cmListFileContext((cmListFileContext *)local_90,pcVar2);
    bVar1 = std::optional::operator_cast_to_bool((optional *)this);
    if (bVar1) {
      top = std::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*(&this->TopSource);
      cmSystemTools::RelativeIfUnder(&local_b0,top,(string *)((long)&lfc.Name.field_2 + 8));
      std::__cxx11::string::operator=
                ((string *)(lfc.Name.field_2._M_local_buf + 8),(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    if (lfc.FilePath.field_2._8_8_ == 0) {
      local_d8 = " in ";
    }
    else {
      local_d8 = " at ";
    }
    os = std::operator<<(out,local_d8);
    ::operator<<(os,(cmListFileContext *)local_90);
    cmListFileContext::~cmListFileContext((cmListFileContext *)local_90);
  }
  return;
}

Assistant:

void cmMessenger::PrintBacktraceTitle(std::ostream& out,
                                      cmListFileBacktrace const& bt) const
{
  // The title exists only if we have a call on top of the bottom.
  if (bt.Empty()) {
    return;
  }
  cmListFileContext lfc = bt.Top();
  if (this->TopSource) {
    lfc.FilePath =
      cmSystemTools::RelativeIfUnder(*this->TopSource, lfc.FilePath);
  }
  out << (lfc.Line ? " at " : " in ") << lfc;
}